

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O1

void __thiscall
icu_63::AnnualTimeZoneRule::AnnualTimeZoneRule(AnnualTimeZoneRule *this,AnnualTimeZoneRule *source)

{
  DateTimeRule *this_00;
  AnnualTimeZoneRule *size;
  
  size = source;
  TimeZoneRule::TimeZoneRule(&this->super_TimeZoneRule,&source->super_TimeZoneRule);
  (this->super_TimeZoneRule).super_UObject._vptr_UObject =
       (_func_int **)&PTR__AnnualTimeZoneRule_003b2580;
  this_00 = (DateTimeRule *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
  if (this_00 == (DateTimeRule *)0x0) {
    this_00 = (DateTimeRule *)0x0;
  }
  else {
    DateTimeRule::DateTimeRule(this_00,source->fDateTimeRule);
  }
  this->fDateTimeRule = this_00;
  this->fStartYear = source->fStartYear;
  this->fEndYear = source->fEndYear;
  return;
}

Assistant:

AnnualTimeZoneRule::AnnualTimeZoneRule(const AnnualTimeZoneRule& source)
: TimeZoneRule(source), fDateTimeRule(new DateTimeRule(*(source.fDateTimeRule))),
  fStartYear(source.fStartYear), fEndYear(source.fEndYear) {
}